

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# galloping_search.hpp
# Opt level: O3

_List_iterator<signed_char>
burst::detail::
galloping_search<std::_List_iterator<signed_char>,int,burst::not_fn_t<burst::invert_t<std::less<void>>>>
          (long *first,long *last,int *value)

{
  long *plVar1;
  long *plVar2;
  _List_iterator<signed_char> _Var3;
  long lVar4;
  difference_type __d;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  plVar2 = first;
  if (first != last) {
    do {
      if (*value < (int)(char)plVar2[2]) break;
      plVar2 = (long *)*plVar2;
    } while (plVar2 != last);
  }
  if ((plVar2 != last) && (plVar2 = (long *)*plVar2, plVar2 != last)) {
    do {
      if ((int)(char)plVar2[2] <= *value) {
        if (plVar2 != last) {
          __assert_fail("std::is_partitioned(first, last, [& value, & compare] (const auto & e) {return compare(e, value);})"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/algorithm/detail/galloping_search.hpp"
                        ,0x16,
                        "RandomAccessIterator burst::detail::galloping_search(RandomAccessIterator, RandomAccessIterator, const Value &, Compare) [RandomAccessIterator = std::_List_iterator<signed char>, Value = int, Compare = burst::not_fn_t<burst::invert_t<std::less<void>>>]"
                       );
        }
        break;
      }
      plVar2 = (long *)*plVar2;
    } while (plVar2 != last);
  }
  plVar2 = last;
  if (first != last) {
    lVar4 = -1;
    plVar1 = first;
    do {
      plVar1 = (long *)*plVar1;
      lVar4 = lVar4 + 1;
    } while (plVar1 != last);
    if (lVar4 != 0) {
      lVar5 = 1;
      lVar6 = 0;
      do {
        plVar2 = first;
        lVar8 = lVar5;
        if (lVar5 < 1) {
          do {
            plVar2 = (long *)plVar2[1];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0);
        }
        else {
          do {
            plVar2 = (long *)*plVar2;
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        if (*value < (int)(char)plVar2[2]) break;
        first = (long *)*plVar2;
        lVar8 = lVar6 + lVar5;
        lVar7 = lVar6 + lVar5 * 3;
        lVar5 = lVar5 * 2;
        plVar2 = last;
        lVar6 = lVar8 + 1;
      } while (lVar7 + 1 <= lVar4);
    }
  }
  _Var3 = std::
          __lower_bound<std::_List_iterator<signed_char>,int,__gnu_cxx::__ops::_Iter_comp_val<burst::not_fn_t<burst::invert_t<std::less<void>>>>>
                    (first,plVar2);
  return (_List_iterator<signed_char>)_Var3._M_node;
}

Assistant:

RandomAccessIterator
            galloping_search
            (
                RandomAccessIterator first, RandomAccessIterator last,
                const Value & value,
                Compare compare
            )
        {
            assert(std::is_partitioned(first, last,
                [& value, & compare] (const auto & e) {return compare(e, value);}));

            const auto distance = std::distance(first, last);

            auto position = static_cast<decltype(distance)>(0);
            auto step = static_cast<decltype(distance)>(1);

            while (position + step < distance)
            {
                const auto current = std::next(first, step);
                if (compare(*current, value))
                {
                    first = std::next(current);
                    position += step + 1;
                    step *= 2;
                }
                else
                {
                    return std::lower_bound(first, current, value, compare);
                }
            }

            return std::lower_bound(first, last, value, compare);
        }